

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O1

JL_STATUS JlUnmarshallFreeStructAllocs
                    (JlMarshallElement *StructDescription,size_t StructDescriptionCount,
                    void *Structure)

{
  JL_STATUS JVar1;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (Structure != (void *)0x0 &&
      (StructDescriptionCount != 0 && StructDescription != (JlMarshallElement *)0x0)) {
    FreeUnmarshalledDictionary(StructDescription,StructDescriptionCount,Structure);
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlUnmarshallFreeStructAllocs
    (
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        void*                       Structure
    )
{
    JL_STATUS jlStatus;

    if(     NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        jlStatus = FreeUnmarshalledDictionary( StructDescription, StructDescriptionCount, Structure );
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}